

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Slot
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint32 slotId)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  RegSlot instance_00;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  uint32 local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x3b);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    local_34 = instance;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x624,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0089139f;
    *puVar3 = 0;
    instance = local_34;
  }
  if (value != 0xffffffff) {
    pFVar4 = this->m_functionWrite;
    if (pFVar4 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      local_34 = slotId;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0089139f;
      *puVar3 = 0;
      pFVar4 = this->m_functionWrite;
      slotId = local_34;
    }
    value_00 = FunctionBody::MapRegSlot(pFVar4,value);
    if (instance != 0xffffffff) {
      pFVar4 = this->m_functionWrite;
      if (pFVar4 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        local_34 = slotId;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_0089139f;
        *puVar3 = 0;
        pFVar4 = this->m_functionWrite;
        slotId = local_34;
      }
      instance_00 = FunctionBody::MapRegSlot(pFVar4,instance);
      if (((op - 0x147 < 0x3d) && ((0x1000000000000081U >> ((ulong)(op - 0x147) & 0x3f) & 1) != 0))
         || (op - 0x1f6 < 3)) {
LAB_008912d7:
        bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,op,value_00,instance_00,slotId);
        if (!bVar2) {
          bVar2 = TryWriteElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,op,value_00,instance_00,slotId);
          if (!bVar2) {
            local_40 = slotId;
            local_3c = value_00;
            local_38 = instance_00;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
            Data::Write(&this->m_byteCodeData,&local_40,0xc);
          }
        }
        return;
      }
      AssertCount = AssertCount + 1;
      local_34 = slotId;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x637,"(false)",
                                  "The specified OpCode is not intended for slot access");
      if (bVar2) {
        *puVar3 = 0;
        slotId = local_34;
        goto LAB_008912d7;
      }
      goto LAB_0089139f;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0089139f:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Slot(OpCode op, RegSlot value, RegSlot instance, uint32 slotId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlot);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);

#if DBG
        switch (op)
        {
#if ENABLE_NATIVE_CODEGEN
        case OpCode::LdSlotArr:
        case OpCode::StSlot:
        case OpCode::StSlotChkUndecl:
#endif
        case OpCode::StObjSlot:
        case OpCode::StObjSlotChkUndecl:
        case OpCode::StPropIdArrFromVar:
            break;

        default:
            AssertMsg(false, "The specified OpCode is not intended for slot access");
            break;
        }
#endif

        MULTISIZE_LAYOUT_WRITE(ElementSlot, op, value, instance, slotId);
    }